

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O0

boolean process_restart(j_decompress_ptr cinfo)

{
  jpeg_entropy_decoder *pjVar1;
  boolean bVar2;
  int local_24;
  int ci;
  huff_entropy_ptr entropy;
  j_decompress_ptr cinfo_local;
  
  pjVar1 = cinfo->entropy;
  cinfo->marker->discarded_bytes =
       *(int *)&pjVar1[1].decode_mcu / 8 + cinfo->marker->discarded_bytes;
  *(undefined4 *)&pjVar1[1].decode_mcu = 0;
  bVar2 = (*cinfo->marker->read_restart_marker)(cinfo);
  if (bVar2 == 0) {
    cinfo_local._4_4_ = 0;
  }
  else {
    for (local_24 = 0; local_24 < cinfo->comps_in_scan; local_24 = local_24 + 1) {
      *(undefined4 *)((long)&pjVar1[2].start_pass + (long)local_24 * 4 + 4) = 0;
    }
    *(undefined4 *)&pjVar1[2].start_pass = 0;
    *(uint *)&pjVar1[3].decode_mcu = cinfo->restart_interval;
    if (cinfo->unread_marker == 0) {
      *(undefined4 *)((long)&pjVar1[3].start_pass + 4) = 0;
    }
    cinfo_local._4_4_ = 1;
  }
  return cinfo_local._4_4_;
}

Assistant:

LOCAL(void)
process_restart (j_decompress_ptr cinfo)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  int ci;
  jpeg_component_info * compptr;

  /* Advance past the RSTn marker */
  if (! (*cinfo->marker->read_restart_marker) (cinfo))
    ERREXIT(cinfo, JERR_CANT_SUSPEND);

  /* Re-initialize statistics areas */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    if (! cinfo->progressive_mode || (cinfo->Ss == 0 && cinfo->Ah == 0)) {
      MEMZERO(entropy->dc_stats[compptr->dc_tbl_no], DC_STAT_BINS);
      /* Reset DC predictions to 0 */
      entropy->last_dc_val[ci] = 0;
      entropy->dc_context[ci] = 0;
    }
    if ((! cinfo->progressive_mode && cinfo->lim_Se) ||
	(cinfo->progressive_mode && cinfo->Ss)) {
      MEMZERO(entropy->ac_stats[compptr->ac_tbl_no], AC_STAT_BINS);
    }
  }

  /* Reset arithmetic decoding variables */
  entropy->c = 0;
  entropy->a = 0;
  entropy->ct = -16;	/* force reading 2 initial bytes to fill C */

  /* Reset restart counter */
  entropy->restarts_to_go = cinfo->restart_interval;
}